

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>::~TArray
          (TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*> *this)

{
  FInternalLightAssociation **block;
  
  block = this->Array;
  if (block != (FInternalLightAssociation **)0x0) {
    if (this->Count != 0) {
      DoDelete(this,0,this->Count - 1);
      block = this->Array;
    }
    M_Free(block);
    this->Array = (FInternalLightAssociation **)0x0;
    this->Most = 0;
    this->Count = 0;
  }
  return;
}

Assistant:

~TArray ()
	{
		if (Array)
		{
			if (Count > 0)
			{
				DoDelete (0, Count-1);
			}
			M_Free (Array);
			Array = NULL;
			Count = 0;
			Most = 0;
		}
	}